

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

base_learner * cbify_setup(options_i *options,vw *all)

{
  float fVar1;
  float fVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  pointer pcVar6;
  uint64_t uVar7;
  float *pfVar8;
  vw *in_RSI;
  int iVar9;
  long *in_RDI;
  single_learner *base_1;
  multi_learner *base;
  learner<cbify,_example> *l;
  stringstream ss_1;
  stringstream ss;
  option_group_definition new_options;
  bool use_cs;
  free_ptr<cbify> data;
  uint32_t num_actions;
  undefined4 in_stack_fffffffffffff248;
  float in_stack_fffffffffffff24c;
  vw *in_stack_fffffffffffff250;
  string *in_stack_fffffffffffff258;
  typed_option<float> *in_stack_fffffffffffff260;
  single_learner *in_stack_fffffffffffff268;
  cbify *in_stack_fffffffffffff270;
  prediction_type_t pred_type;
  uint64_t in_stack_fffffffffffff280;
  size_t in_stack_fffffffffffff288;
  void *in_stack_fffffffffffff290;
  typed_option<float> *in_stack_fffffffffffff298;
  option_group_definition *in_stack_fffffffffffff2a0;
  allocator *paVar10;
  byte local_ce2;
  learner<char,_char> *in_stack_fffffffffffff410;
  typed_option<float> *local_be8;
  string local_be0 [39];
  allocator local_bb9;
  string local_bb8 [32];
  float local_b98;
  float local_b94;
  stringstream local_b90 [16];
  undefined1 local_b80 [383];
  allocator local_a01;
  string local_a00 [32];
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  string local_998 [39];
  allocator local_971;
  string local_970 [32];
  string local_950 [39];
  allocator local_929;
  string local_928 [32];
  stringstream local_908 [16];
  undefined1 local_8f8 [383];
  allocator local_779;
  string local_778 [32];
  action_score *local_758;
  action_score *local_750;
  action_score *local_748;
  size_t local_740;
  allocator local_731;
  string local_730 [32];
  undefined4 local_710;
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [359];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [359];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [359];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  typed_option<unsigned_int> local_1e8 [2];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [63];
  byte local_31;
  undefined1 local_30 [20];
  uint local_1c;
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<cbify>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Make Multiclass into Contextual Bandit",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff250,
             (string *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"cbify",&local_209);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff258,(uint *)in_stack_fffffffffffff250)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,"Convert multiclass on <k> classes into a contextual bandit problem",
             &local_231);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff250,
             (string *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff250,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff2a0,(typed_option<unsigned_int> *)in_stack_fffffffffffff298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"cbify_cs",&local_399);
  VW::config::make_option<bool>(in_stack_fffffffffffff258,(bool *)in_stack_fffffffffffff250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c0,"consume cost-sensitive classification examples instead of multiclass",
             &local_3c1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff250,
             (string *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff250,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff2a0,(typed_option<bool> *)in_stack_fffffffffffff298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"loss0",&local_529);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293873);
  VW::config::make_option<float>(in_stack_fffffffffffff258,(float *)in_stack_fffffffffffff250);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff260,(float)((ulong)in_stack_fffffffffffff258 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"loss for correct label",&local_551);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff250,
             (string *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff250,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b8,"loss1",&local_6b9);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x293973);
  VW::config::make_option<float>(in_stack_fffffffffffff258,(float *)in_stack_fffffffffffff250);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff260,(float)((ulong)in_stack_fffffffffffff258 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"loss for incorrect label",&local_6e1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff250,
             (string *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff250,
             (typed_option<float> *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  (**(code **)*local_10)(local_10,local_70);
  plVar4 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"cbify",&local_709);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_708);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  plVar4 = local_10;
  if (((bVar5 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"cb_explore_adf",&local_731);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_730);
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2940cb);
    pcVar6->use_adf = (bool)(bVar5 & 1);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    uVar7 = uniform_hash(in_stack_fffffffffffff290,in_stack_fffffffffffff288,
                         in_stack_fffffffffffff280);
    pred_type = (prediction_type_t)in_stack_fffffffffffff280;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x29411e);
    pcVar6->app_seed = uVar7;
    v_init<ACTION_SCORE::action_score>();
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294146);
    pvVar3 = local_18;
    (pcVar6->a_s)._begin = local_758;
    (pcVar6->a_s)._end = local_750;
    (pcVar6->a_s).end_array = local_748;
    (pcVar6->a_s).erase_count = local_740;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294193);
    pcVar6->all = pvVar3;
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2941ac);
    if ((pcVar6->use_adf & 1U) != 0) {
      std::unique_ptr<cbify,_void_(*)(void_*)>::get
                ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff250);
      init_adf_data(in_stack_fffffffffffff270,(size_t)in_stack_fffffffffffff268);
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_778,"cb_explore",&local_779);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_778);
    local_ce2 = 0;
    if ((bVar5 & 1) == 0) {
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2942a6);
      local_ce2 = pcVar6->use_adf ^ 0xff;
    }
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    if ((local_ce2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_908);
      std::ostream::operator<<(local_8f8,local_1c);
      plVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_928,"cb_explore",&local_929);
      std::__cxx11::stringstream::str();
      (**(code **)(*plVar4 + 0x28))(plVar4,local_928,local_950);
      std::__cxx11::string::~string(local_950);
      std::__cxx11::string::~string(local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
      std::__cxx11::stringstream::~stringstream(local_908);
    }
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2944aa);
    plVar4 = local_10;
    if ((pcVar6->use_adf & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,"cb_min_cost",&local_971);
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294504);
      std::__cxx11::to_string(in_stack_fffffffffffff24c);
      (**(code **)(*plVar4 + 0x28))(plVar4,local_970,local_998);
      std::__cxx11::string::~string(local_998);
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      plVar4 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b8,"cb_max_cost",&local_9b9);
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2945b5);
      std::__cxx11::to_string(in_stack_fffffffffffff24c);
      (**(code **)(*plVar4 + 0x28))(plVar4,local_9b8,local_9e0);
      std::__cxx11::string::~string(local_9e0);
      std::__cxx11::string::~string(local_9b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a00,"baseline",&local_a01);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_a00);
    std::__cxx11::string::~string(local_a00);
    std::allocator<char>::~allocator((allocator<char> *)&local_a01);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_b90);
      iVar9 = (int)local_30;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2947ae);
      std::abs(iVar9);
      iVar9 = (int)local_30;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x2947e5);
      std::abs(iVar9);
      pfVar8 = std::max<float>(&local_b94,&local_b98);
      fVar1 = *pfVar8;
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294846);
      fVar2 = pcVar6->loss1;
      pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                         ((unique_ptr<cbify,_void_(*)(void_*)> *)0x29485e);
      std::ostream::operator<<(local_b80,fVar1 / (fVar2 - pcVar6->loss0));
      paVar10 = &local_bb9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bb8,"lr_multiplier",paVar10);
      std::__cxx11::stringstream::str();
      (**(code **)(*local_10 + 0x28))(local_10,local_bb8,local_be0);
      std::__cxx11::string::~string(local_be0);
      std::__cxx11::string::~string(local_bb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
      std::__cxx11::stringstream::~stringstream(local_b90);
    }
    pcVar6 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                       ((unique_ptr<cbify,_void_(*)(void_*)> *)0x294a18);
    if ((pcVar6->use_adf & 1U) == 0) {
      in_stack_fffffffffffff270 =
           (cbify *)setup_base((options_i *)in_stack_fffffffffffff258,in_stack_fffffffffffff250);
      in_stack_fffffffffffff268 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff410);
      if ((local_31 & 1) == 0) {
        local_be8 = (typed_option<float> *)
                    LEARNER::init_multiclass_learner<cbify,example,LEARNER::learner<char,example>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff270,
                               in_stack_fffffffffffff268,
                               (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff260,
                               (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff258,(parser *)in_stack_fffffffffffff250,
                               CONCAT44(in_stack_fffffffffffff24c,4),pred_type);
      }
      else {
        in_stack_fffffffffffff260 =
             (typed_option<float> *)
             LEARNER::init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,example>>
                       ((free_ptr<cbify> *)in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                        (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff260,
                        (_func_void_cbify_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff258,(parser *)in_stack_fffffffffffff250,
                        CONCAT44(in_stack_fffffffffffff24c,4),pred_type);
        local_be8 = in_stack_fffffffffffff260;
      }
    }
    else {
      setup_base((options_i *)in_stack_fffffffffffff258,in_stack_fffffffffffff250);
      LEARNER::as_multiline<char,char>(in_stack_fffffffffffff410);
      if ((local_31 & 1) == 0) {
        local_be8 = (typed_option<float> *)
                    LEARNER::
                    init_multiclass_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff270,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffff268,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff260,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff258,(parser *)in_stack_fffffffffffff250,
                               CONCAT44(in_stack_fffffffffffff24c,4),pred_type);
      }
      else {
        local_be8 = (typed_option<float> *)
                    LEARNER::
                    init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff270,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffff268,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff260,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                                *)in_stack_fffffffffffff258,(parser *)in_stack_fffffffffffff250,
                               CONCAT44(in_stack_fffffffffffff24c,4),pred_type);
      }
    }
    LEARNER::learner<cbify,_example>::set_finish
              ((learner<cbify,_example> *)in_stack_fffffffffffff270,
               (_func_void_cbify_ptr *)in_stack_fffffffffffff268);
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    in_stack_fffffffffffff250 =
         (vw *)LEARNER::make_base<cbify,example>((learner<cbify,_example> *)local_be8);
    local_8 = in_stack_fffffffffffff250;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_710 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff250);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff260);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}